

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O0

uint32_t Diligent::jenkins_rev_mix32(uint32_t key)

{
  uint uVar1;
  uint32_t key_local;
  
  uVar1 = (key * 0x1001 >> 0x16 ^ key * 0x1001) * 0x11;
  uVar1 = (uVar1 >> 9 ^ uVar1) * 0x401;
  return (uVar1 >> 2 ^ uVar1) * 0x81081;
}

Assistant:

constexpr uint32_t jenkins_rev_mix32(uint32_t key) noexcept
{
    key += (key << 12); // key *= (1 + (1 << 12))
    key ^= (key >> 22);
    key += (key << 4); // key *= (1 + (1 << 4))
    key ^= (key >> 9);
    key += (key << 10); // key *= (1 + (1 << 10))
    key ^= (key >> 2);
    // key *= (1 + (1 << 7)) * (1 + (1 << 12))
    key += (key << 7);
    key += (key << 12);
    return key;
}